

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O0

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddField(DuckTableEntry *this,ClientContext *context,AddFieldInfo *info)

{
  bool bVar1;
  reference pvVar2;
  long in_RCX;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_> in_RDI;
  idx_t in_stack_00000120;
  ChangeColumnTypeInfo change_column_type;
  templated_unique_single_t function;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  StructMappingInfo res;
  ColumnDefinition *col;
  ChangeColumnTypeInfo *in_stack_00000488;
  ClientContext *in_stack_00000490;
  DuckTableEntry *in_stack_00000498;
  string *in_stack_fffffffffffffc38;
  LogicalType *other;
  TableCatalogEntry *in_stack_fffffffffffffc40;
  LogicalType *in_stack_fffffffffffffc48;
  Value *in_stack_fffffffffffffc50;
  AlterInfo *this_00;
  string *prepended_message;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> this_01;
  Value *args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffcd0;
  LogicalType *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffcf0;
  __atomic_base<unsigned_long> in_stack_fffffffffffffd00;
  char (*in_stack_fffffffffffffd08) [13];
  LogicalType *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  undefined1 local_130 [136];
  ErrorData local_a8;
  ColumnDefinition *local_28;
  long local_20;
  
  args = (Value *)0x0;
  this_01._M_head_impl =
       (CatalogEntry *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
       super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
  local_20 = in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
  local_28 = TableCatalogEntry::GetColumn(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  ColumnDefinition::Type(local_28);
  AddFieldToStruct((LogicalType *)
                   change_column_type.super_AlterTableInfo.super_AlterInfo.catalog._0_8_,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo._8_8_,
                   (ColumnDefinition *)
                   change_column_type.super_AlterTableInfo.super_AlterInfo.super_ParseInfo.
                   _vptr_ParseInfo,in_stack_00000120);
  bVar1 = ErrorData::HasError(&local_a8);
  if (bVar1) {
    if ((*(byte *)(local_20 + 0x168) & 1) == 0) {
      prepended_message = (string *)(local_130 + 0x37);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_130 + 0x38),anon_var_dwarf_3eb64fd + 9,
                 (allocator *)prepended_message);
      ErrorData::Throw((ErrorData *)this_01._M_head_impl,prepended_message);
    }
    unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>::
    unique_ptr<std::default_delete<duckdb::CatalogEntry>,void>
              ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    local_130._48_4_ = 1;
  }
  else {
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)0x14ec1e8);
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
    make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar2);
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::ColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffc40,
               (unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
                *)in_stack_fffffffffffffc38);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x14ec253);
    unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
    ::~unique_ptr((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                   *)0x14ec260);
    LogicalType::LogicalType
              ((LogicalType *)in_stack_fffffffffffffc40,(LogicalType *)in_stack_fffffffffffffc38);
    Value::Value(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>(args);
    this_00 = (AlterInfo *)local_130;
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::ConstantExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffc40,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
                *)in_stack_fffffffffffffc38);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x14ec2e0);
    unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                 *)0x14ec2ed);
    Value::~Value((Value *)in_stack_fffffffffffffc40);
    LogicalType::~LogicalType((LogicalType *)0x14ec307);
    ColumnDefinition::Name_abi_cxx11_(local_28);
    ColumnDefinition::Type(local_28);
    ConstructMapping(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    make_uniq<duckdb::ConstantExpression,duckdb::Value>(args);
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::ConstantExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffc40,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>_>
                *)in_stack_fffffffffffffc38);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x14ec39a);
    unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                 *)0x14ec3a7);
    Value::~Value((Value *)in_stack_fffffffffffffc40);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::push_back((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    make_uniq<duckdb::FunctionExpression,char_const(&)[13],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              (in_stack_fffffffffffffd08,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)in_stack_fffffffffffffd00._M_i);
    AlterInfo::GetAlterEntryData(this_00);
    pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
    ::std::__cxx11::string::string((string *)&stack0xfffffffffffffcd8,(string *)pvVar2);
    other = (LogicalType *)&stack0xfffffffffffffcc0;
    LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffc40,other);
    in_stack_fffffffffffffc40 = (TableCatalogEntry *)&stack0xfffffffffffffcb8;
    unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
    unique_ptr<duckdb::FunctionExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
              ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffc40,
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                *)other);
    ChangeColumnTypeInfo::ChangeColumnTypeInfo
              ((ChangeColumnTypeInfo *)in_stack_fffffffffffffcf0,
               (AlterEntryData *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
               in_stack_fffffffffffffcd8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)in_stack_fffffffffffffcd0._M_pi);
    unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)0x14ec498);
    LogicalType::~LogicalType((LogicalType *)0x14ec4a5);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd8);
    AlterEntryData::~AlterEntryData((AlterEntryData *)in_stack_fffffffffffffc40);
    ChangeColumnType(in_stack_00000498,in_stack_00000490,in_stack_00000488);
    local_130._48_4_ = 1;
    ChangeColumnTypeInfo::~ChangeColumnTypeInfo((ChangeColumnTypeInfo *)in_stack_fffffffffffffc40);
    unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>::
    ~unique_ptr((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                 *)0x14ec505);
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               *)0x14ec512);
  }
  StructMappingInfo::~StructMappingInfo((StructMappingInfo *)in_stack_fffffffffffffc40);
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
         super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddField(ClientContext &context, AddFieldInfo &info) {
	// follow the path
	auto &col = GetColumn(info.column_path[0]);
	auto res = AddFieldToStruct(col.Type(), info.column_path, info.new_field);
	if (res.error.HasError()) {
		if (!info.if_field_not_exists) {
			res.error.Throw();
		}
		return nullptr;
	}

	// construct the struct remapping expression
	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(make_uniq<ColumnRefExpression>(info.column_path[0]));
	children.push_back(make_uniq<ConstantExpression>(Value(res.new_type)));
	children.push_back(make_uniq<ConstantExpression>(ConstructMapping(col.Name(), col.Type())));
	children.push_back(std::move(res.default_value));

	auto function = make_uniq<FunctionExpression>("remap_struct", std::move(children));

	ChangeColumnTypeInfo change_column_type(info.GetAlterEntryData(), info.column_path[0], std::move(res.new_type),
	                                        std::move(function));
	return ChangeColumnType(context, change_column_type);
}